

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

HighsInt __thiscall
HighsOrbitopeMatrix::orbitalFixing(HighsOrbitopeMatrix *this,HighsDomain *domain)

{
  bool bVar1;
  HighsHashTable<int,_int> *this_00;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *key;
  reference piVar2;
  ValueType *pVVar3;
  reference pvVar4;
  const_reference pvVar5;
  HighsDomain *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  HighsInt *i;
  HighsInt pos;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  bool isPacking;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgstack;
  vector<int,_std::allocator<int>_> *branchpos;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rowUsed;
  vector<int,_std::allocator<int>_> rows;
  HighsDomain *in_stack_00000108;
  vector<int,_std::allocator<int>_> *in_stack_00000110;
  HighsOrbitopeMatrix *in_stack_00000118;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  allocator_type *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  HighsHashTable<int,_int> *local_80;
  byte local_71;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_70;
  HighsHashTable<int,_int> *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48 [2];
  HighsDomain *local_18;
  HighsInt local_4;
  
  local_18 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6c3801);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x6c3821);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x6c3847);
  std::vector<int,_std::allocator<int>_>::reserve(in_RDI,in_stack_ffffffffffffff38);
  this_00 = (HighsHashTable<int,_int> *)HighsDomain::getBranchingPositions(local_18);
  local_68 = this_00;
  key = HighsDomain::getDomainChangeStack(local_18);
  local_71 = 1;
  local_80 = local_68;
  local_70 = key;
  local_88._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff08);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_88);
    in_stack_ffffffffffffff20 =
         (allocator_type *)
         &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
              (local_70,(long)*piVar2);
    pVVar3 = HighsHashTable<int,_int>::find(this_00,(KeyType_conflict *)key);
    if (pVVar3 != (ValueType *)0x0) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_48,(long)*pVVar3);
      if (*pvVar4 == '\0') {
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (local_48,(long)*pVVar3);
        *pvVar4 = '\x01';
        in_stack_ffffffffffffff1c = in_stack_ffffffffffffff1c & 0xffffff;
        if ((local_71 & 1) != 0) {
          pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)
                              &in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,(long)*pVVar3);
          in_stack_ffffffffffffff1c = CONCAT13(*pvVar5 != '\0',(int3)in_stack_ffffffffffffff1c);
        }
        local_71 = (byte)(in_stack_ffffffffffffff1c >> 0x18);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_88);
  }
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
  if (bVar1) {
    local_4 = 0;
  }
  else if ((local_71 & 1) == 0) {
    local_4 = orbitalFixingForFullOrbitope
                        ((HighsOrbitopeMatrix *)
                         rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                         (vector<int,_std::allocator<int>_> *)
                         rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         (HighsDomain *)
                         rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
  }
  else {
    local_4 = orbitalFixingForPackingOrbitope(in_stack_00000118,in_stack_00000110,in_stack_00000108)
    ;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff20);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
  return local_4;
}

Assistant:

HighsInt HighsOrbitopeMatrix::orbitalFixing(HighsDomain& domain) const {
  std::vector<HighsInt> rows;
  std::vector<uint8_t> rowUsed(numRows);

  rows.reserve(numRows);

  const auto& branchpos = domain.getBranchingPositions();
  const auto& domchgstack = domain.getDomainChangeStack();

  bool isPacking = true;
  for (HighsInt pos : branchpos) {
    const HighsInt* i = columnToRow.find(domchgstack[pos].column);
    if (i && !rowUsed[*i]) {
      rowUsed[*i] = true;
      isPacking = isPacking && rowIsSetPacking[*i] != 0;
      rows.push_back(*i);
    }
  }

  if (rows.empty()) return 0;

  if (isPacking) return orbitalFixingForPackingOrbitope(rows, domain);

  return orbitalFixingForFullOrbitope(rows, domain);
}